

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::bt_peer_connection::get_specific_peer_info(bt_peer_connection *this,peer_info *p)

{
  sha256_hash dest;
  sha256_hash dest_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  socket_type *psVar4;
  undefined4 extraout_var;
  string_view s;
  peer_flags_t *local_168;
  digest32<256L> local_120 [2];
  system_error *anon_var_0;
  uint auStack_d0 [2];
  uint local_c8 [2];
  uint auStack_c0 [8];
  string_view local_a0;
  vector<char,_std::allocator<char>_> local_90;
  span<const_char> local_78;
  hasher256 local_68;
  system_error *psStack_60;
  sha256_hash b32_addr;
  torrent_peer *pi;
  peer_info *p_local;
  bt_peer_connection *this_local;
  
  bVar1 = peer_connection::is_interesting(&this->super_peer_connection);
  if (bVar1) {
    libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::operator|=
              (&p->flags,(bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)1);
  }
  uVar2 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0xc])();
  if ((uVar2 & 1) != 0) {
    libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::operator|=
              (&p->flags,(bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)2);
  }
  bVar1 = peer_connection::is_peer_interested(&this->super_peer_connection);
  if (bVar1) {
    libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::operator|=
              (&p->flags,(bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)4);
  }
  bVar1 = peer_connection::has_peer_choked(&this->super_peer_connection);
  if (bVar1) {
    libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::operator|=
              (&p->flags,(bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)8);
  }
  bVar1 = support_extensions(this);
  if (bVar1) {
    libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::operator|=
              (&p->flags,(bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)0x10);
  }
  bVar1 = peer_connection::is_outgoing(&this->super_peer_connection);
  if (bVar1) {
    libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::operator|=
              (&p->flags,(bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)0x20);
  }
  psVar4 = peer_connection::get_socket(&this->super_peer_connection);
  bVar1 = is_i2p(psVar4);
  if (bVar1) {
    libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::operator|=
              (&p->flags,(bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)0x10000);
    iVar3 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[7])();
    b32_addr.m_number._M_elems._24_8_ = CONCAT44(extraout_var,iVar3);
    if ((torrent_peer *)b32_addr.m_number._M_elems._24_8_ == (torrent_peer *)0x0) {
      digest32<256L>::digest32(local_120);
      dest_00.m_number._M_elems[2] = local_120[0].m_number._M_elems[2];
      dest_00.m_number._M_elems[3] = local_120[0].m_number._M_elems[3];
      dest_00.m_number._M_elems[0] = local_120[0].m_number._M_elems[0];
      dest_00.m_number._M_elems[1] = local_120[0].m_number._M_elems[1];
      dest_00.m_number._M_elems[4] = local_120[0].m_number._M_elems[4];
      dest_00.m_number._M_elems[5] = local_120[0].m_number._M_elems[5];
      dest_00.m_number._M_elems[6] = local_120[0].m_number._M_elems[6];
      dest_00.m_number._M_elems[7] = local_120[0].m_number._M_elems[7];
      v1_2::peer_info::set_i2p_destination(p,dest_00);
    }
    else {
      local_a0 = torrent_peer::dest((torrent_peer *)b32_addr.m_number._M_elems._24_8_);
      s._M_len = local_a0._M_str;
      s._M_str = (char *)local_a0._M_len;
      base64decode_i2p(&local_90,(libtorrent *)local_a0._M_len,s);
      span<char_const>::span<std::vector<char,std::allocator<char>>,char,void>
                ((span<char_const> *)&local_78,&local_90);
      lcrypto::hasher256::hasher256(&local_68,local_78);
      lcrypto::hasher256::final((sha256_hash *)&psStack_60,&local_68);
      lcrypto::hasher256::~hasher256(&local_68);
      ::std::vector<char,_std::allocator<char>_>::~vector(&local_90);
      local_c8[0] = b32_addr.m_number._M_elems[2];
      local_c8[1] = b32_addr.m_number._M_elems[3];
      auStack_c0[0] = b32_addr.m_number._M_elems[4];
      auStack_c0[1] = b32_addr.m_number._M_elems[5];
      anon_var_0 = psStack_60;
      auStack_d0[0] = b32_addr.m_number._M_elems[0];
      auStack_d0[1] = b32_addr.m_number._M_elems[1];
      dest.m_number._M_elems[2] = b32_addr.m_number._M_elems[0];
      dest.m_number._M_elems[3] = b32_addr.m_number._M_elems[1];
      dest.m_number._M_elems._0_8_ = psStack_60;
      dest.m_number._M_elems[4] = b32_addr.m_number._M_elems[2];
      dest.m_number._M_elems[5] = b32_addr.m_number._M_elems[3];
      dest.m_number._M_elems[6] = b32_addr.m_number._M_elems[4];
      dest.m_number._M_elems[7] = b32_addr.m_number._M_elems[5];
      v1_2::peer_info::set_i2p_destination(p,dest);
    }
  }
  psVar4 = peer_connection::get_socket(&this->super_peer_connection);
  bVar1 = is_utp(psVar4);
  if (bVar1) {
    libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::operator|=
              (&p->flags,(bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)0x20000);
  }
  psVar4 = peer_connection::get_socket(&this->super_peer_connection);
  bVar1 = is_ssl(psVar4);
  if (bVar1) {
    libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::operator|=
              (&p->flags,(bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)0x40000);
  }
  if (((byte)(this->super_peer_connection).field_0x889 >> 6 & 1) != 0) {
    if ((char)(this->super_peer_connection).field_0x889 < '\0') {
      local_168 = &v1_2::peer_info::rc4_encrypted;
    }
    else {
      local_168 = &v1_2::peer_info::plaintext_encrypted;
    }
    libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::operator|=
              (&p->flags,
               (bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)local_168->m_val);
  }
  bVar1 = peer_connection::is_connecting(&this->super_peer_connection);
  if (!bVar1) {
    uVar2 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x1b])();
    if ((uVar2 & 1) != 0) {
      libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::operator|=
                (&p->flags,(bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)0x40);
    }
  }
  bVar1 = peer_connection::is_connecting(&this->super_peer_connection);
  if (bVar1) {
    libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::operator|=
              (&p->flags,(bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)0x80);
  }
  ::std::__cxx11::string::operator=((string *)p,(string *)&this->m_client_version);
  (p->connection_type).m_val = '\x01';
  return;
}

Assistant:

void bt_peer_connection::get_specific_peer_info(peer_info& p) const
	{
		TORRENT_ASSERT(!associated_torrent().expired());

		if (is_interesting()) p.flags |= peer_info::interesting;
		if (is_choked()) p.flags |= peer_info::choked;
		if (is_peer_interested()) p.flags |= peer_info::remote_interested;
		if (has_peer_choked()) p.flags |= peer_info::remote_choked;
		if (support_extensions()) p.flags |= peer_info::supports_extensions;
		if (is_outgoing()) p.flags |= peer_info::local_connection;
#if TORRENT_USE_I2P
		if (is_i2p(get_socket()))
		{
			p.flags |= peer_info::i2p_socket;
			auto const* pi = peer_info_struct();
			if (pi != nullptr)
			{
				try
				{
					sha256_hash const b32_addr = hasher256(base64decode_i2p(pi->dest())).final();
					p.set_i2p_destination(b32_addr);
				}
				catch (lt::system_error const&)
				{
					p.set_i2p_destination(sha256_hash());
				}
			}
			else
			{
				p.set_i2p_destination(sha256_hash());
			}
		}
#endif
		if (is_utp(get_socket())) p.flags |= peer_info::utp_socket;
		if (is_ssl(get_socket())) p.flags |= peer_info::ssl_socket;

#if !defined TORRENT_DISABLE_ENCRYPTION
		if (m_encrypted)
		{
			p.flags |= m_rc4_encrypted
				? peer_info::rc4_encrypted
				: peer_info::plaintext_encrypted;
		}
#endif

		if (!is_connecting() && in_handshake())
			p.flags |= peer_info::handshake;
		if (is_connecting()) p.flags |= peer_info::connecting;

		p.client = m_client_version;
		p.connection_type = peer_info::standard_bittorrent;
	}